

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

LINK_ENDPOINT_HANDLE session_create_link_endpoint(SESSION_HANDLE session,char *name)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  ON_ENDPOINT_FRAME_RECEIVED p_Var3;
  LINK_ENDPOINT_INSTANCE **ppLVar4;
  LOGGER_LOG p_Var5;
  size_t local_70;
  size_t local_68;
  ulong local_60;
  LOGGER_LOG l;
  size_t realloc_size;
  LINK_ENDPOINT_INSTANCE **new_link_endpoints;
  size_t name_length;
  size_t i;
  handle selected_handle;
  SESSION_INSTANCE *session_instance;
  LINK_ENDPOINT_INSTANCE *result;
  char *name_local;
  SESSION_HANDLE session_local;
  
  if ((session == (SESSION_HANDLE)0x0) || (name == (char *)0x0)) {
    session_instance = (SESSION_INSTANCE *)0x0;
  }
  else {
    session_instance = (SESSION_INSTANCE *)calloc(1,0x50);
    if (session_instance != (SESSION_INSTANCE *)0x0) {
      name_length = 0;
      for (i._4_4_ = 0;
          (name_length < session->link_endpoint_count &&
          (session->link_endpoints[name_length]->output_handle <= i._4_4_)); i._4_4_ = i._4_4_ + 1)
      {
        name_length = name_length + 1;
      }
      session_instance->connection = (CONNECTION_HANDLE)0x0;
      session_instance->endpoint = (ENDPOINT_HANDLE)0x0;
      *(ON_ENDPOINT_FRAME_RECEIVED *)&session_instance->session_state =
           (ON_ENDPOINT_FRAME_RECEIVED)0x0;
      session_instance->link_endpoints = (LINK_ENDPOINT_INSTANCE **)0x0;
      *(uint *)((long)&session_instance->frame_received_callback_context + 4) = i._4_4_;
      *(handle *)&session_instance->frame_received_callback_context = 0xffffffff;
      *(LINK_ENDPOINT_STATE *)&session_instance->on_link_attached = LINK_ENDPOINT_STATE_NOT_ATTACHED
      ;
      sVar2 = strlen(name);
      p_Var3 = (ON_ENDPOINT_FRAME_RECEIVED)malloc(sVar2 + 1);
      session_instance->frame_received_callback = p_Var3;
      session_instance->on_link_attached_callback_context = (ON_LINK_ENDPOINT_DESTROYED_CALLBACK)0x0
      ;
      *(void **)&session_instance->next_outgoing_id = (void *)0x0;
      if (session_instance->frame_received_callback == (ON_ENDPOINT_FRAME_RECEIVED)0x0) {
        free(session_instance);
        session_instance = (SESSION_INSTANCE *)0x0;
      }
      else {
        memcpy(session_instance->frame_received_callback,name,sVar2 + 1);
        *(SESSION_HANDLE *)&session_instance->link_endpoint_count = session;
        if ((ulong)session->link_endpoint_count < 0xfffffffffffffffe) {
          local_60 = (ulong)session->link_endpoint_count + 1;
        }
        else {
          local_60 = 0xffffffffffffffff;
        }
        if (local_60 == 0) {
          local_68 = 0;
        }
        else {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_60;
          if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < 0x50) {
            local_70 = 0xffffffffffffffff;
          }
          else {
            local_70 = local_60 * 0x50;
          }
          local_68 = local_70;
        }
        if ((local_68 == 0xffffffffffffffff) ||
           (ppLVar4 = (LINK_ENDPOINT_INSTANCE **)realloc(session->link_endpoints,local_68),
           ppLVar4 == (LINK_ENDPOINT_INSTANCE **)0x0)) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/session.c"
                      ,"session_create_link_endpoint",0x487,1,
                      "Cannot realloc new_link_endpoints, size:%zu",local_68);
          }
          free(session_instance->frame_received_callback);
          free(session_instance);
          session_instance = (SESSION_INSTANCE *)0x0;
        }
        else {
          session->link_endpoints = ppLVar4;
          if (session->link_endpoint_count != i._4_4_) {
            memmove(session->link_endpoints + (i._4_4_ + 1),session->link_endpoints + i._4_4_,
                    (ulong)(session->link_endpoint_count - i._4_4_) << 3);
          }
          session->link_endpoints[i._4_4_] = (LINK_ENDPOINT_INSTANCE *)session_instance;
          session->link_endpoint_count = session->link_endpoint_count + 1;
        }
      }
    }
  }
  return (LINK_ENDPOINT_HANDLE)session_instance;
}

Assistant:

LINK_ENDPOINT_HANDLE session_create_link_endpoint(SESSION_HANDLE session, const char* name)
{
    LINK_ENDPOINT_INSTANCE* result;

    /* Codes_S_R_S_SESSION_01_044: [If session, name or frame_received_callback is NULL, session_create_link_endpoint shall fail and return NULL.] */
    if ((session == NULL) ||
        (name == NULL))
    {
        result = NULL;
    }
    else
    {
        /* Codes_S_R_S_SESSION_01_043: [session_create_link_endpoint shall create a link endpoint associated with a given session and return a non-NULL handle to it.] */
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;

        result = (LINK_ENDPOINT_INSTANCE*)calloc(1, sizeof(LINK_ENDPOINT_INSTANCE));
        /* Codes_S_R_S_SESSION_01_045: [If allocating memory for the link endpoint fails, session_create_link_endpoint shall fail and return NULL.] */
        if (result != NULL)
        {
            /* Codes_S_R_S_SESSION_01_046: [An unused handle shall be assigned to the link endpoint.] */
            handle selected_handle = 0;
            size_t i;
            size_t name_length;

            for (i = 0; i < session_instance->link_endpoint_count; i++)
            {
                if (session_instance->link_endpoints[i]->output_handle > selected_handle)
                {
                    break;
                }

                selected_handle++;
            }

            result->on_session_state_changed = NULL;
            result->on_session_flow_on = NULL;
            result->frame_received_callback = NULL;
            result->callback_context = NULL;
            result->output_handle = selected_handle;
            result->input_handle = 0xFFFFFFFF;
            result->link_endpoint_state = LINK_ENDPOINT_STATE_NOT_ATTACHED;
            name_length = strlen(name);
            result->name = (char*)malloc(name_length + 1);
            result->on_link_endpoint_destroyed_callback = NULL;
            result->on_link_endpoint_destroyed_context = NULL;
            if (result->name == NULL)
            {
                /* Codes_S_R_S_SESSION_01_045: [If allocating memory for the link endpoint fails, session_create_link_endpoint shall fail and return NULL.] */
                free(result);
                result = NULL;
            }
            else
            {
                LINK_ENDPOINT_INSTANCE** new_link_endpoints;
                (void)memcpy(result->name, name, name_length + 1);
                result->session = session;

                size_t realloc_size = safe_add_size_t((size_t)session_instance->link_endpoint_count, 1);
                realloc_size = safe_multiply_size_t(realloc_size, sizeof(LINK_ENDPOINT_INSTANCE));
                if (realloc_size == SIZE_MAX ||
                    (new_link_endpoints = (LINK_ENDPOINT_INSTANCE**)realloc(session_instance->link_endpoints, realloc_size)) == NULL)
                {
                    /* Codes_S_R_S_SESSION_01_045: [If allocating memory for the link endpoint fails, session_create_link_endpoint shall fail and return NULL.] */
                    LogError("Cannot realloc new_link_endpoints, size:%zu", realloc_size);
                    free(result->name);
                    free(result);
                    result = NULL;
                }
                else
                {
                    session_instance->link_endpoints = new_link_endpoints;

                    if (session_instance->link_endpoint_count - selected_handle > 0)
                    {
                        (void)memmove(&session_instance->link_endpoints[selected_handle + 1], &session_instance->link_endpoints[selected_handle], (session_instance->link_endpoint_count - selected_handle) * sizeof(LINK_ENDPOINT_INSTANCE*));
                    }

                    session_instance->link_endpoints[selected_handle] = result;
                    session_instance->link_endpoint_count++;
                }
            }
        }
    }

    return result;
}